

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O2

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::AddStartState::operator()
          (AddStartState *this,iterator_t *str,iterator_t *end)

{
  ParserPOMDPFormat_Spirit *pPVar1;
  ostream *poVar2;
  E *this_00;
  E e;
  stringstream ss;
  ostream local_188 [376];
  
  pPVar1 = this->_m_po;
  if (pPVar1->_m_lp_type == STRING) {
    _ss = MADPComponentDiscreteStates::GetStateIndexByName
                    (&(pPVar1->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                      super_MultiAgentDecisionProcessDiscrete._m_S,&pPVar1->_m_lp_string);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->_m_po->_m_startStateListSI,(value_type_conflict1 *)&ss);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_188,
                           "SetStartState::operator()(iterator_t str, iterator_t end) - expected a string as last parsed type! (at"
                          );
  poVar2 = POMDPFormatParsing::operator<<(poVar2,&str->_pos);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(_m_po->_m_lp_type != STRING)
                {
                    std::stringstream ss; ss << "SetStartState::operator()(iterator_t str, iterator_t end) - expected a string as last parsed type! (at"<<str.get_position() <<")"<<std::endl;
                    throw E(ss);
                }
                try
                {
                    Index sI = _m_po->GetPOMDPDiscrete()->GetStateIndexByName(
                            _m_po->_m_lp_string);
                    _m_po->_m_startStateListSI.push_back(sI);
                }
                catch(E e)
                {
                    std::stringstream ss; ss << e.SoftPrint() << "(at"<<
                        str.get_position() <<")"<<std::endl;
                    throw E(ss);
                }
            }